

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManComputeMapping(Mf_Man_t *p)

{
  Mf_Obj_t *pMVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  char *pTitle;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint *pCut;
  float fVar10;
  uint local_378;
  float local_374;
  uint local_370;
  int Time;
  uint *local_368;
  int local_35c;
  ulong local_358;
  uint *local_350;
  long local_348;
  Mf_Obj_t *local_340;
  undefined1 local_338 [776];
  
  uVar7 = 0;
  do {
    if ((long)p->pGia->nObjs <= (long)uVar7) {
      Mf_ManSetMapRefs(p);
      if (p->fUseEla == 0) {
        pTitle = "Area ";
        if (p->Iter == 0) {
          pTitle = "Delay";
        }
      }
      else {
        pTitle = "Ela  ";
      }
      Mf_ManPrintStats(p,pTitle);
      return;
    }
    iVar8 = (int)uVar7;
    pGVar4 = Gia_ManObj(p->pGia,iVar8);
    if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
      local_348 = uVar7 * 0x10;
      pMVar1 = p->pLfObjs;
      local_368 = (uint *)Mf_ObjCutSet(p,iVar8);
      Time = 0;
      iVar2 = -1;
      if ((p->fUseEla != 0) && (0xffff < *(uint *)&pMVar1[uVar7].field_0xc)) {
        piVar5 = Mf_ObjCutSet(p,iVar8);
        iVar2 = Mf_CutDeref_rec(p,piVar5 + 1);
      }
      puVar6 = local_368 + 1;
      local_378 = 1000000000;
      uVar9 = 0;
      pCut = (uint *)0x0;
      local_374 = 1e+09;
      local_35c = iVar2;
      local_358 = uVar7;
      local_350 = puVar6;
      local_340 = pMVar1 + uVar7;
      for (iVar8 = 0; pMVar1 = local_340, iVar8 < (int)*local_368; iVar8 = iVar8 + 1) {
        if (((*puVar6 & 0x1f) == 1) && (local_358 == puVar6[1])) {
          __assert_fail("!Mf_CutIsTriv(pCut, iObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x5ff,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->pPars->nLutSize < (int)(*puVar6 & 0x1f)) {
          __assert_fail("Mf_CutSize(pCut) <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                        ,0x600,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
        }
        if (p->fUseEla == 0) {
          fVar10 = Mf_CutFlow(p,(int *)puVar6,&Time);
          uVar9 = Time;
        }
        else {
          iVar2 = Mf_CutRef_rec(p,(int *)puVar6);
          iVar3 = Mf_CutDeref_rec(p,(int *)puVar6);
          if (iVar2 != iVar3) {
            __assert_fail("Ela1 == Ela2",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                          ,0x5e2,"int Mf_CutAreaDerefed(Mf_Man_t *, int *)");
          }
          fVar10 = (float)iVar2;
        }
        if (pCut == (uint *)0x0) {
LAB_005ca3e3:
          pCut = puVar6;
          local_378 = uVar9;
          local_374 = fVar10;
        }
        else if ((fVar10 < local_374) ||
                (((local_374 == fVar10 && (!NAN(local_374) && !NAN(fVar10))) &&
                 ((int)uVar9 < (int)local_378)))) goto LAB_005ca3e3;
        puVar6 = puVar6 + (ulong)(*puVar6 & 0x1f) + 1;
      }
      local_370 = local_378;
      if (pCut == (uint *)0x0) {
        __assert_fail("pCutBest != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                      ,0x605,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
      }
      if ((p->fUseEla == 0) || (*(uint *)&local_340->field_0xc < 0x10000)) {
        *(uint *)&local_340->field_0xc = *(uint *)&local_340->field_0xc & 0xffff;
        iVar8 = local_35c;
      }
      else {
        iVar8 = Mf_CutRef_rec(p,(int *)pCut);
      }
      if (iVar8 < -1) {
        __assert_fail("Value1 >= Value2",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                      ,0x60a,"void Mf_ObjComputeBestCut(Mf_Man_t *, int)");
      }
      if (p->fUseEla != 0) {
        Mf_CutFlow(p,(int *)pCut,(int *)&local_370);
        local_378 = local_370 & 0xffff;
      }
      puVar6 = local_350;
      *(short *)&pMVar1->field_0xc = (short)local_378;
      pMVar1->Flow = local_374 / *(float *)((long)&p->pLfObjs->nFlowRefs + local_348);
      if (pCut <= local_368) {
        __assert_fail("pCuts < pCut",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMf.c"
                      ,0x2b6,"void Mf_ObjSetBestCut(int *, int *)");
      }
      uVar7 = local_358;
      if (local_350 < pCut) {
        uVar9 = *pCut;
        uVar7 = ((long)pCut - (long)local_350) * 0x40000000 >> 0x1e & 0xfffffffffffffffc;
        memcpy(local_338,local_350,uVar7);
        memmove(puVar6,pCut,(ulong)(uVar9 & 0x1f) * 4 + 4);
        memcpy(puVar6 + (ulong)(uVar9 & 0x1f) + 1,local_338,uVar7);
        uVar7 = local_358;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void Mf_ManComputeMapping( Mf_Man_t * p )
{
    int i;
    Gia_ManForEachAndId( p->pGia, i )
        Mf_ObjComputeBestCut( p, i );
    Mf_ManSetMapRefs( p );
    Mf_ManPrintStats( p, (char *)(p->fUseEla ? "Ela  " : (p->Iter ? "Area " : "Delay")) );
}